

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O3

vm_obj_id_t
CVmDynamicFunc::create
          (int in_root_set,vm_obj_id_t globals,vm_obj_id_t locals,vm_obj_id_t macros,vm_val_t *src)

{
  vm_obj_id_t vVar1;
  ushort *puVar2;
  
  puVar2 = (ushort *)vm_val_t::get_as_string(src);
  if (puVar2 != (ushort *)0x0) {
    vVar1 = create(in_root_set,globals,locals,macros,src,(char *)(puVar2 + 1),(ulong)*puVar2);
    return vVar1;
  }
  err_throw(0x900);
}

Assistant:

vm_obj_id_t CVmDynamicFunc::create(VMG_ int in_root_set,
                                   vm_obj_id_t globals, vm_obj_id_t locals,
                                   vm_obj_id_t macros,
                                   const vm_val_t *src)
{
    /* get the source value as a string */
    const char *src_txt = src->get_as_string(vmg0_);

    /* if it's not a string value, it's an error */
    if (src_txt == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* create the object */
    return create(vmg_ in_root_set, globals, locals, macros,
                  src, src_txt + VMB_LEN, vmb_get_len(src_txt));
}